

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberformatter.h
# Opt level: O0

bool __thiscall icu_63::number::impl::MacroProps::copyErrorTo(MacroProps *this,UErrorCode *status)

{
  UBool UVar1;
  bool local_19;
  UErrorCode *status_local;
  MacroProps *this_local;
  
  UVar1 = Notation::copyErrorTo(&this->notation,status);
  local_19 = true;
  if (UVar1 == '\0') {
    UVar1 = Precision::copyErrorTo(&this->precision,status);
    local_19 = true;
    if (UVar1 == '\0') {
      UVar1 = Padder::copyErrorTo(&this->padder,status);
      local_19 = true;
      if (UVar1 == '\0') {
        UVar1 = IntegerWidth::copyErrorTo(&this->integerWidth,status);
        local_19 = true;
        if (UVar1 == '\0') {
          UVar1 = SymbolsWrapper::copyErrorTo(&this->symbols,status);
          local_19 = true;
          if (UVar1 == '\0') {
            UVar1 = Scale::copyErrorTo(&this->scale,status);
            local_19 = UVar1 != '\0';
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool copyErrorTo(UErrorCode &status) const {
        return notation.copyErrorTo(status) || precision.copyErrorTo(status) ||
               padder.copyErrorTo(status) || integerWidth.copyErrorTo(status) ||
               symbols.copyErrorTo(status) || scale.copyErrorTo(status);
    }